

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

int __thiscall
GrcFont::GetGlyfContours(GrcFont *this,gid16 wGlyphID,vector<int,_std::allocator<int>_> *pvnEndPt)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  void *pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t *in_stack_00000008;
  void *in_stack_00000010;
  size_t in_stack_00000018;
  size_t cTmpCnt;
  int *rgnEndPt;
  size_t cContours;
  undefined6 in_stack_00000040;
  gid16 in_stack_00000054;
  size_t *in_stack_00000060;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  undefined8 local_28;
  undefined4 local_4;
  
  bVar2 = TtfUtil::GlyfContourCount
                    (cContours._4_2_,rgnEndPt,(void *)cTmpCnt,in_stack_00000018,in_stack_00000010,
                     in_stack_00000008);
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    bVar2 = TtfUtil::GlyfContourEndPoints
                      (in_stack_00000054,this,(void *)CONCAT26(wGlyphID,in_stack_00000040),
                       (size_t)pvnEndPt,
                       (void *)CONCAT26(cContours._6_2_,
                                        CONCAT24(cContours._4_2_,(undefined4)cContours)),rgnEndPt,
                       in_stack_00000060);
    if (bVar2) {
      std::vector<int,std::allocator<int>>::assign<int*,void>
                (in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      local_4 = 1;
    }
    else {
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GrcFont::GetGlyfContours(gid16 wGlyphID, std::vector<int> * pvnEndPt)
{
	Assert(m_pFile);
	Assert(m_pGlyf);
	Assert(m_pLoca);
	Assert(m_pHead);

	size_t cContours;

// these checks are actually done by GlyfContourCount
// they're only needed if a specific error msg needs to be generated
#if 0 
	if (TtfUtil::IsSpace(wGlyphID, m_pLoca, m_cLoca, m_pHead))
		return false;

	if (TtfUtil::IsDeepComposite(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead))
		return false;
#endif

	if (!TtfUtil::GlyfContourCount(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead, cContours))
		return false;

	int * rgnEndPt = new int[cContours];
	size_t cTmpCnt = cContours;

	if (!TtfUtil::GlyfContourEndPoints(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead, 
		rgnEndPt, cTmpCnt))
	{
		delete[] rgnEndPt;
		return false;
	}

	pvnEndPt->assign(rgnEndPt, rgnEndPt + cContours);
	delete[] rgnEndPt;

	return true;
}